

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O0

char * Diligent::Parsing::SkipDelimitersAndComments<char_const*>
                 (char **Start,char **End,char *Delimiters,SKIP_COMMENT_FLAGS CommentFlags)

{
  char *pcVar1;
  bool bVar2;
  char *BlockStart;
  char *Pos;
  char *pcStack_20;
  SKIP_COMMENT_FLAGS CommentFlags_local;
  char *Delimiters_local;
  char **End_local;
  char **Start_local;
  
  BlockStart = *Start;
  Pos._4_4_ = CommentFlags;
  pcStack_20 = Delimiters;
  Delimiters_local = (char *)End;
  End_local = Start;
  while( true ) {
    pcVar1 = BlockStart;
    bVar2 = false;
    if (BlockStart != *(char **)Delimiters_local) {
      bVar2 = *BlockStart != '\0';
    }
    if (!bVar2) break;
    BlockStart = SkipDelimiters<char_const*>(&BlockStart,(char **)Delimiters_local,pcStack_20);
    BlockStart = SkipComment<char_const*>(&BlockStart,(char **)Delimiters_local,Pos._4_4_);
    if (BlockStart == pcVar1) {
      return BlockStart;
    }
  }
  return BlockStart;
}

Assistant:

IteratorType SkipDelimitersAndComments(const IteratorType& Start,
                                       const IteratorType& End,
                                       const char*         Delimiters   = nullptr,
                                       SKIP_COMMENT_FLAGS  CommentFlags = SKIP_COMMENT_FLAG_ALL) noexcept(false)
{
    auto Pos = Start;
    while (Pos != End && *Pos != '\0')
    {
        const auto BlockStart = Pos;

        Pos = SkipDelimiters(Pos, End, Delimiters);
        Pos = SkipComment(Pos, End, CommentFlags); // May throw
        if (Pos == BlockStart)
            break;
    };

    return Pos;
}